

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pluginlist.cpp
# Opt level: O3

bool __thiscall ON_PlugInRef::Read(ON_PlugInRef *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  int minor_version;
  int major_version;
  int local_28 [2];
  
  Default(this);
  local_28[0] = 0;
  local_28[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,local_28 + 1,local_28);
  if (bVar1) {
    bVar1 = false;
    if ((local_28[1] == 1) && (bVar1 = false, -1 < local_28[0])) {
      bVar1 = ON_BinaryArchive::ReadUuid(file,&this->m_plugin_id);
      if ((bVar1) &&
         (((bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_plugin_type), bVar1 &&
           (bVar1 = ON_BinaryArchive::ReadString(file,&this->m_plugin_name), bVar1)) &&
          (bVar1 = ON_BinaryArchive::ReadString(file,&this->m_plugin_version), bVar1)))) {
        bVar1 = ON_BinaryArchive::ReadString(file,&this->m_plugin_filename);
      }
      else {
        bVar1 = false;
      }
      if (0 < local_28[0]) {
        if (bVar1 == false) {
          bVar1 = false;
        }
        else {
          bVar1 = ON_BinaryArchive::ReadString(file,&this->m_developer_organization);
          if (((((bVar1) &&
                (bVar1 = ON_BinaryArchive::ReadString(file,&this->m_developer_address), bVar1)) &&
               ((bVar1 = ON_BinaryArchive::ReadString(file,&this->m_developer_country), bVar1 &&
                ((bVar1 = ON_BinaryArchive::ReadString(file,&this->m_developer_phone), bVar1 &&
                 (bVar1 = ON_BinaryArchive::ReadString(file,&this->m_developer_email), bVar1))))))
              && (bVar1 = ON_BinaryArchive::ReadString(file,&this->m_developer_website), bVar1)) &&
             (bVar1 = ON_BinaryArchive::ReadString(file,&this->m_developer_updateurl), bVar1)) {
            bVar1 = ON_BinaryArchive::ReadString(file,&this->m_developer_fax);
          }
          else {
            bVar1 = false;
          }
        }
        if (1 < local_28[0]) {
          if (bVar1 != false) {
            bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_plugin_platform);
          }
          if (bVar1 != false) {
            bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_plugin_sdk_version);
          }
          if (bVar1 != false) {
            bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_plugin_sdk_service_release);
          }
        }
      }
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
    return (bool)(bVar2 & bVar1);
  }
  return false;
}

Assistant:

bool ON_PlugInRef::Read( ON_BinaryArchive& file )
{
  Default();

  int major_version = 0;
  int minor_version = 0;

  bool rc = file.BeginRead3dmChunk(
                  TCODE_ANONYMOUS_CHUNK,
                  &major_version,
                  &minor_version);

  if (rc)
  {
    if( 1 == major_version && minor_version >= 0 )
    {
      //version 1.0 fields
      if (rc) rc = file.ReadUuid(m_plugin_id);
      if (rc) rc = file.ReadInt(&m_plugin_type);
      if (rc) rc = file.ReadString(m_plugin_name);
      if (rc) rc = file.ReadString(m_plugin_version);
      if (rc) rc = file.ReadString(m_plugin_filename);

      if ( minor_version >= 1)
      {
        // version 1.1 fields
        if (rc) rc = file.ReadString(m_developer_organization);
        if (rc) rc = file.ReadString(m_developer_address);
        if (rc) rc = file.ReadString(m_developer_country);
        if (rc) rc = file.ReadString(m_developer_phone);
        if (rc) rc = file.ReadString(m_developer_email);
        if (rc) rc = file.ReadString(m_developer_website);
        if (rc) rc = file.ReadString(m_developer_updateurl);
        if (rc) rc = file.ReadString(m_developer_fax);

        if ( minor_version >= 2 )
        {
          if (rc) rc = file.ReadInt(&m_plugin_platform);
          if (rc) rc = file.ReadInt(&m_plugin_sdk_version);
          if (rc) rc = file.ReadInt(&m_plugin_sdk_service_release);
        }
      }
    }
    else
    {
      rc = false;
    }

    if( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}